

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O0

JDIMENSION get_scaled_gray_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  long lVar1;
  size_t sVar2;
  long in_RSI;
  long *in_RDI;
  JDIMENSION col;
  JSAMPLE *rescale;
  U_CHAR *bufferptr;
  JSAMPROW ptr;
  ppm_source_ptr source;
  int local_34;
  byte *local_28;
  undefined1 *local_20;
  
  lVar1 = *(long *)(in_RSI + 0x48);
  sVar2 = fread(*(void **)(in_RSI + 0x30),1,*(size_t *)(in_RSI + 0x40),*(FILE **)(in_RSI + 0x18));
  if (sVar2 != *(size_t *)(in_RSI + 0x40)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x2b;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_28 = *(byte **)(in_RSI + 0x30);
  local_20 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  for (local_34 = (int)in_RDI[6]; local_34 != 0; local_34 = local_34 + -1) {
    *local_20 = *(undefined1 *)(lVar1 + (int)(uint)*local_28);
    local_28 = local_28 + 1;
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_scaled_gray_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading raw-byte-format PGM files with any maxval */
{
  ppm_source_ptr source = (ppm_source_ptr)sinfo;
  register JSAMPROW ptr;
  register U_CHAR *bufferptr;
  register JSAMPLE *rescale = source->rescale;
  JDIMENSION col;

  if (!ReadOK(source->pub.input_file, source->iobuffer, source->buffer_width))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  ptr = source->pub.buffer[0];
  bufferptr = source->iobuffer;
  for (col = cinfo->image_width; col > 0; col--) {
    *ptr++ = rescale[UCH(*bufferptr++)];
  }
  return 1;
}